

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O2

int libssh2_base64_decode(LIBSSH2_SESSION *session,char **data,uint *datalen,char *src,uint src_len)

{
  ushort uVar1;
  int errcode;
  char *pcVar2;
  long lVar3;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  char cVar9;
  
  pcVar2 = (char *)(*session->alloc)((ulong)((src_len * 3 >> 2) + 1),&session->abstract);
  *data = pcVar2;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "Unable to allocate memory for base64 decoding";
    errcode = -6;
  }
  else {
    pbVar5 = (byte *)(src + src_len);
    uVar4 = 0;
    uVar7 = 0;
    for (; uVar6 = (uint)uVar7, src < pbVar5; src = (char *)((byte *)src + 1)) {
      uVar1 = base64_reverse_table[(byte)*src];
      if ((short)uVar1 < 0) goto LAB_00115320;
      if (3 < (uint)((long)(int)uVar4 % 4)) goto LAB_0011531e;
      lVar3 = (long)(int)uVar6;
      bVar8 = (byte)uVar1;
      switch((long)(int)uVar4 % 4 & 0xffffffff) {
      case 0:
        pcVar2[lVar3] = bVar8 * '\x04';
        break;
      case 1:
        pcVar2[lVar3] = pcVar2[lVar3] | (byte)(uVar1 >> 4);
        cVar9 = bVar8 << 4;
        goto LAB_00115319;
      case 2:
        pcVar2[lVar3] = pcVar2[lVar3] | (byte)(uVar1 >> 2);
        cVar9 = bVar8 << 6;
LAB_00115319:
        uVar7 = lVar3 + 1;
        pcVar2[lVar3 + 1] = cVar9;
        break;
      case 3:
        uVar7 = (ulong)(uVar6 + 1);
        pcVar2[lVar3] = pcVar2[lVar3] | bVar8;
      }
LAB_0011531e:
      uVar4 = uVar4 + 1;
LAB_00115320:
    }
    if ((uVar4 & 0x80000003) != 1) {
      *datalen = uVar6;
      return 0;
    }
    (*session->free)(*data,&session->abstract);
    pcVar2 = "Invalid base64";
    errcode = -0x22;
  }
  _libssh2_error(session,errcode,pcVar2);
  return errcode;
}

Assistant:

LIBSSH2_API int
libssh2_base64_decode(LIBSSH2_SESSION *session, char **data,
                      unsigned int *datalen, const char *src,
                      unsigned int src_len)
{
    unsigned char *s, *d;
    short v;
    int i = 0, len = 0;

    *data = LIBSSH2_ALLOC(session, (3 * src_len / 4) + 1);
    d = (unsigned char *) *data;
    if (!d) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for base64 decoding");
    }

    for(s = (unsigned char *) src; ((char *) s) < (src + src_len); s++) {
        if ((v = base64_reverse_table[*s]) < 0)
            continue;
        switch (i % 4) {
        case 0:
            d[len] = (unsigned char)(v << 2);
            break;
        case 1:
            d[len++] |= v >> 4;
            d[len] = (unsigned char)(v << 4);
            break;
        case 2:
            d[len++] |= v >> 2;
            d[len] = (unsigned char)(v << 6);
            break;
        case 3:
            d[len++] |= v;
            break;
        }
        i++;
    }
    if ((i % 4) == 1) {
        /* Invalid -- We have a byte which belongs exclusively to a partial
           octet */
        LIBSSH2_FREE(session, *data);
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL, "Invalid base64");
    }

    *datalen = len;
    return 0;
}